

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O0

bool __thiscall leveldb::DBImpl::GetProperty(DBImpl *this,Slice *property,string *value)

{
  bool bVar1;
  uint uVar2;
  int64_t iVar3;
  long lVar4;
  long in_RDI;
  long in_FS_OFFSET;
  size_t total_usage;
  int files;
  int level_1;
  bool ok;
  uint64_t level;
  Slice prefix;
  Slice in;
  MutexLock l;
  char buf_2 [50];
  char buf_1 [200];
  char buf [100];
  VersionSet *in_stack_fffffffffffffcf8;
  undefined4 in_stack_fffffffffffffd00;
  int in_stack_fffffffffffffd04;
  VersionSet *in_stack_fffffffffffffd08;
  Slice *in_stack_fffffffffffffd10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd18;
  Slice *in_stack_fffffffffffffd20;
  undefined7 in_stack_fffffffffffffd28;
  undefined1 in_stack_fffffffffffffd2f;
  Version *in_stack_fffffffffffffd40;
  char *__s;
  undefined4 in_stack_fffffffffffffd48;
  uint uVar5;
  undefined4 in_stack_fffffffffffffd4c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd50;
  undefined4 in_stack_fffffffffffffd58;
  undefined4 in_stack_fffffffffffffd5c;
  bool local_283;
  long local_268;
  uint local_258;
  bool local_221;
  ulong local_1f0;
  char local_1a8 [96];
  char local_148 [208];
  char local_78 [112];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::clear
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffcf8);
  MutexLock::MutexLock((MutexLock *)in_stack_fffffffffffffcf8,(Mutex *)0xd154bd);
  Slice::Slice((Slice *)in_stack_fffffffffffffd08,
               (char *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00));
  bVar1 = Slice::starts_with((Slice *)in_stack_fffffffffffffd18,in_stack_fffffffffffffd10);
  if (bVar1) {
    Slice::size((Slice *)in_stack_fffffffffffffcf8);
    Slice::remove_prefix
              ((Slice *)in_stack_fffffffffffffd08,
               CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00));
    Slice::Slice((Slice *)in_stack_fffffffffffffd08,
                 (char *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00));
    bVar1 = Slice::starts_with((Slice *)in_stack_fffffffffffffd18,in_stack_fffffffffffffd10);
    if (bVar1) {
      Slice::remove_prefix
                ((Slice *)in_stack_fffffffffffffd08,
                 CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00));
      bVar1 = ConsumeDecimalNumber
                        ((Slice *)in_stack_fffffffffffffd50,
                         (uint64_t *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
      local_283 = false;
      if (bVar1) {
        local_283 = Slice::empty((Slice *)in_stack_fffffffffffffcf8);
      }
      if ((local_283 == false) || (6 < local_1f0)) {
        local_221 = false;
      }
      else {
        uVar2 = VersionSet::NumLevelFiles(in_stack_fffffffffffffd08,in_stack_fffffffffffffd04);
        snprintf(local_78,100,"%d",(ulong)uVar2);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffd08,
                   (char *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00));
        local_221 = true;
      }
    }
    else {
      Slice::Slice((Slice *)in_stack_fffffffffffffd08,
                   (char *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00));
      bVar1 = leveldb::operator==((Slice *)CONCAT17(in_stack_fffffffffffffd2f,
                                                    in_stack_fffffffffffffd28),
                                  in_stack_fffffffffffffd20);
      if (bVar1) {
        snprintf(local_148,200,
                 "                               Compactions\nLevel  Files Size(MB) Time(sec) Read(MB) Write(MB)\n--------------------------------------------------\n"
                );
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (in_stack_fffffffffffffd18,(char *)in_stack_fffffffffffffd10);
        for (local_258 = 0; (int)local_258 < 7; local_258 = local_258 + 1) {
          uVar2 = VersionSet::NumLevelFiles(in_stack_fffffffffffffd08,in_stack_fffffffffffffd04);
          if ((0 < *(long *)(in_RDI + 0x238 + (long)(int)local_258 * 0x18)) || (0 < (int)uVar2)) {
            __s = local_148;
            uVar5 = local_258;
            iVar3 = VersionSet::NumLevelBytes(in_stack_fffffffffffffd08,in_stack_fffffffffffffd04);
            lVar4 = (long)(int)local_258;
            snprintf(__s,200,"%3d %8d %8.0f %9.0f %8.0f %9.0f\n",
                     SUB84((double)iVar3 * 9.5367431640625e-07,0),
                     (double)*(long *)(in_RDI + 0x238 + lVar4 * 0x18) / 1000000.0,
                     (double)*(long *)(in_RDI + 0x240 + lVar4 * 0x18) * 9.5367431640625e-07,
                     (double)*(long *)(in_RDI + 0x248 + lVar4 * 0x18) * 9.5367431640625e-07,
                     (ulong)uVar5,(ulong)uVar2);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                      (in_stack_fffffffffffffd18,(char *)in_stack_fffffffffffffd10);
          }
        }
        local_221 = true;
      }
      else {
        Slice::Slice((Slice *)in_stack_fffffffffffffd08,
                     (char *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00));
        bVar1 = leveldb::operator==((Slice *)CONCAT17(in_stack_fffffffffffffd2f,
                                                      in_stack_fffffffffffffd28),
                                    in_stack_fffffffffffffd20);
        if (bVar1) {
          VersionSet::current(in_stack_fffffffffffffcf8);
          Version::DebugString_abi_cxx11_(in_stack_fffffffffffffd40);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58),
                     in_stack_fffffffffffffd50);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffcf8);
          local_221 = true;
        }
        else {
          Slice::Slice((Slice *)in_stack_fffffffffffffd08,
                       (char *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00));
          bVar1 = leveldb::operator==((Slice *)CONCAT17(in_stack_fffffffffffffd2f,
                                                        in_stack_fffffffffffffd28),
                                      in_stack_fffffffffffffd20);
          if (bVar1) {
            local_268 = (**(code **)(**(long **)(in_RDI + 0x60) + 0x48))();
            if (*(long *)(in_RDI + 0x130) != 0) {
              in_stack_fffffffffffffd18 =
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   MemTable::ApproximateMemoryUsage((MemTable *)in_stack_fffffffffffffcf8);
              local_268 = (long)&(in_stack_fffffffffffffd18->_M_dataplus)._M_p + local_268;
            }
            if (*(long *)(in_RDI + 0x138) != 0) {
              in_stack_fffffffffffffd10 =
                   (Slice *)MemTable::ApproximateMemoryUsage((MemTable *)in_stack_fffffffffffffcf8);
              local_268 = (long)&in_stack_fffffffffffffd10->data_ + local_268;
            }
            snprintf(local_1a8,0x32,"%llu",local_268);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                      (in_stack_fffffffffffffd18,(char *)in_stack_fffffffffffffd10);
            local_221 = true;
          }
          else {
            local_221 = false;
          }
        }
      }
    }
  }
  else {
    local_221 = false;
  }
  MutexLock::~MutexLock((MutexLock *)in_stack_fffffffffffffcf8);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_221;
}

Assistant:

bool DBImpl::GetProperty(const Slice& property, std::string* value) {
  value->clear();

  MutexLock l(&mutex_);
  Slice in = property;
  Slice prefix("leveldb.");
  if (!in.starts_with(prefix)) return false;
  in.remove_prefix(prefix.size());

  if (in.starts_with("num-files-at-level")) {
    in.remove_prefix(strlen("num-files-at-level"));
    uint64_t level;
    bool ok = ConsumeDecimalNumber(&in, &level) && in.empty();
    if (!ok || level >= config::kNumLevels) {
      return false;
    } else {
      char buf[100];
      snprintf(buf, sizeof(buf), "%d",
               versions_->NumLevelFiles(static_cast<int>(level)));
      *value = buf;
      return true;
    }
  } else if (in == "stats") {
    char buf[200];
    snprintf(buf, sizeof(buf),
             "                               Compactions\n"
             "Level  Files Size(MB) Time(sec) Read(MB) Write(MB)\n"
             "--------------------------------------------------\n");
    value->append(buf);
    for (int level = 0; level < config::kNumLevels; level++) {
      int files = versions_->NumLevelFiles(level);
      if (stats_[level].micros > 0 || files > 0) {
        snprintf(buf, sizeof(buf), "%3d %8d %8.0f %9.0f %8.0f %9.0f\n", level,
                 files, versions_->NumLevelBytes(level) / 1048576.0,
                 stats_[level].micros / 1e6,
                 stats_[level].bytes_read / 1048576.0,
                 stats_[level].bytes_written / 1048576.0);
        value->append(buf);
      }
    }
    return true;
  } else if (in == "sstables") {
    *value = versions_->current()->DebugString();
    return true;
  } else if (in == "approximate-memory-usage") {
    size_t total_usage = options_.block_cache->TotalCharge();
    if (mem_) {
      total_usage += mem_->ApproximateMemoryUsage();
    }
    if (imm_) {
      total_usage += imm_->ApproximateMemoryUsage();
    }
    char buf[50];
    snprintf(buf, sizeof(buf), "%llu",
             static_cast<unsigned long long>(total_usage));
    value->append(buf);
    return true;
  }

  return false;
}